

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.hpp
# Opt level: O2

void __thiscall
antlr::TokenRefCount<antlr::Token>::~TokenRefCount(TokenRefCount<antlr::Token> *this)

{
  uint *puVar1;
  TokenRef *this_00;
  
  this_00 = this->ref;
  if (this_00 != (TokenRef *)0x0) {
    puVar1 = &this_00->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      TokenRef::~TokenRef(this_00);
      operator_delete(this_00,0x10);
      return;
    }
  }
  return;
}

Assistant:

~TokenRefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}